

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  uint uVar1;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_CDict *cdict_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CStream *zcs_local;
  
  zcs_local = (ZSTD_CStream *)ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)zcs_local);
  if (uVar1 == 0) {
    zcs_local = (ZSTD_CStream *)ZSTD_CCtx_setPledgedSrcSize(zcs,pledgedSrcSize);
    uVar1 = ERR_isError((size_t)zcs_local);
    if (uVar1 == 0) {
      memcpy(&zcs->requestedParams,params,0xb0);
      if (dict == (void *)0x0) {
        zcs_local = (ZSTD_CStream *)ZSTD_CCtx_refCDict(zcs,cdict);
        uVar1 = ERR_isError((size_t)zcs_local);
      }
      else {
        zcs_local = (ZSTD_CStream *)ZSTD_CCtx_loadDictionary(zcs,dict,dictSize);
        uVar1 = ERR_isError((size_t)zcs_local);
      }
      if (uVar1 == 0) {
        zcs_local = (ZSTD_CStream *)0x0;
      }
    }
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    const ZSTD_CCtx_params* params,
                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    zcs->requestedParams = *params;
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if (dict) {
        FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    } else {
        /* Dictionary is cleared if !cdict */
        FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    }
    return 0;
}